

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void __thiscall csguide_webserver::ThreadPool::Shutdown(ThreadPool *this,bool graceful)

{
  int iVar1;
  ostream *poVar2;
  reference pvVar3;
  byte in_SIL;
  MutexLockGuard *in_RDI;
  int i;
  MutexLockGuard guard;
  MutexLock *in_stack_ffffffffffffffc8;
  int local_28;
  
  MutexLockGuard::MutexLockGuard(in_RDI,in_stack_ffffffffffffffc8);
  if (*(int *)((long)&in_RDI[0xd].mutex_ + 4) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"has shutdown");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  *(uint *)((long)&in_RDI[0xd].mutex_ + 4) = (in_SIL & 1) + 1;
  Condition::NotifyAll((Condition *)0x119416);
  MutexLockGuard::~MutexLockGuard((MutexLockGuard *)0x119422);
  for (local_28 = 0; local_28 < *(int *)&in_RDI[0xc].mutex_; local_28 = local_28 + 1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0xe),
                        (long)local_28);
    iVar1 = pthread_join(*pvVar3,(void **)0x0);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"pthread_join error");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void ThreadPool::Shutdown(bool graceful) {
  {
    MutexLockGuard guard(this->mutex_);
    if (shutdown_) {
      std::cout << "has shutdown" << std::endl;
    }
    shutdown_ = graceful ? graceful_mode : immediate_mode;
      condition_.NotifyAll();
  }
  for (int i = 0; i < thread_size_; i++) {
    if (pthread_join(threads_[i], NULL) != 0) {
      std::cout << "pthread_join error" << std::endl;
    }
  }
}